

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall re2::Regexp::ParseState::DoVerticalBar(ParseState *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  Regexp *pRVar3;
  Regexp *pRVar4;
  Regexp *this_00;
  
  MaybeConcatString(this,-1,NoParseFlags);
  DoConcatenation(this);
  pRVar3 = this->stacktop_;
  if (((pRVar3 == (Regexp *)0x0) || (pRVar4 = pRVar3->down_, pRVar4 == (Regexp *)0x0)) ||
     (pRVar4->op_ != '\x17')) {
    PushSimpleOp(this,kRegexpCharClass|kRegexpLiteral);
    return true;
  }
  this_00 = pRVar4->down_;
  if ((this_00 != (Regexp *)0x0) && ((uVar1 = pRVar3->op_, uVar1 == '\f' || (this_00->op_ == '\f')))
     ) {
    uVar2 = this_00->op_;
    if (uVar2 == '\f') {
      if (((uVar1 == '\x03') || (uVar1 == '\x14')) || (uVar1 == '\f')) {
        this->stacktop_ = pRVar4;
        this_00 = pRVar3;
LAB_001cd594:
        Decref(this_00);
        return true;
      }
    }
    else if ((uVar1 == '\f') && (((uVar2 == '\x03' || (uVar2 == '\x14')) || (uVar2 == '\f')))) {
      pRVar3->down_ = this_00->down_;
      pRVar4->down_ = pRVar3;
      this->stacktop_ = pRVar4;
      goto LAB_001cd594;
    }
  }
  pRVar3->down_ = this_00;
  pRVar4->down_ = pRVar3;
  this->stacktop_ = pRVar4;
  return true;
}

Assistant:

bool Regexp::ParseState::DoVerticalBar() {
  MaybeConcatString(-1, NoParseFlags);
  DoConcatenation();

  // Below the vertical bar is a list to alternate.
  // Above the vertical bar is a list to concatenate.
  // We just did the concatenation, so either swap
  // the result below the vertical bar or push a new
  // vertical bar on the stack.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) != NULL &&
      (r2 = r1->down_) != NULL &&
      r2->op() == kVerticalBar) {
    Regexp* r3;
    if ((r3 = r2->down_) != NULL &&
        (r1->op() == kRegexpAnyChar || r3->op() == kRegexpAnyChar)) {
      // AnyChar is above or below the vertical bar. Let it subsume
      // the other when the other is Literal, CharClass or AnyChar.
      if (r3->op() == kRegexpAnyChar &&
          (r1->op() == kRegexpLiteral ||
           r1->op() == kRegexpCharClass ||
           r1->op() == kRegexpAnyChar)) {
        // Discard r1.
        stacktop_ = r2;
        r1->Decref();
        return true;
      }
      if (r1->op() == kRegexpAnyChar &&
          (r3->op() == kRegexpLiteral ||
           r3->op() == kRegexpCharClass ||
           r3->op() == kRegexpAnyChar)) {
        // Rearrange the stack and discard r3.
        r1->down_ = r3->down_;
        r2->down_ = r1;
        stacktop_ = r2;
        r3->Decref();
        return true;
      }
    }
    // Swap r1 below vertical bar (r2).
    r1->down_ = r2->down_;
    r2->down_ = r1;
    stacktop_ = r2;
    return true;
  }
  return PushSimpleOp(kVerticalBar);
}